

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O2

extraction_status_t __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_dynamic_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
::extract(mchain_template<so_5::mchain_props::details::limited_dynamic_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
          *this,demand_t *dest,select_case_t *select_case)

{
  extraction_status_t eVar1;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->m_lock);
  if ((this->m_queue).m_queue.
      super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this->m_queue).m_queue.
      super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (this->m_status == closed) {
      eVar1 = chain_closed;
    }
    else {
      *(select_case_t **)(select_case + 0x18) = this->m_select_tail;
      this->m_select_tail = select_case;
      eVar1 = no_messages;
    }
  }
  else {
    eVar1 = extract_demand_from_not_empty_queue(this,dest);
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return eVar1;
}

Assistant:

virtual extraction_status_t
		extract(
			demand_t & dest,
			select_case_t & select_case ) override
			{
				std::unique_lock< std::mutex > lock{ m_lock };

				const bool queue_empty = m_queue.is_empty();
				if( queue_empty )
					{
						if( details::status::closed == m_status )
							// There is no need to wait for something.
							return extraction_status_t::chain_closed;

						// In other cases select_tail must be modified.
						select_case.set_next( m_select_tail );
						m_select_tail = &select_case;

						return extraction_status_t::no_messages;
					}
				else
					return extract_demand_from_not_empty_queue( dest );
			}